

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateDSTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::DynamicState::anon_unknown_0::DepthBoundsParamTestInstance::iterate
          (TestStatus *__return_storage_ptr__,DepthBoundsParamTestInstance *this)

{
  Context *this_00;
  DeviceInterface *pDVar1;
  Image *this_01;
  int iVar2;
  int iVar3;
  TestStatus *pTVar4;
  bool bVar5;
  VkResult result;
  VkQueue pVVar6;
  Allocator *allocator;
  deUint32 height;
  int y;
  deUint32 width;
  int x;
  int x_00;
  float lineWidth;
  float fVar8;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  allocator<char> local_165;
  float local_164;
  undefined8 local_160;
  undefined4 local_158;
  TestStatus *local_150;
  TestLog *local_148;
  VkQueue local_140;
  double local_138;
  double local_130;
  string local_128 [32];
  ConstPixelBufferAccess renderedFrame;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  Texture2D referenceFrame;
  VkSubmitInfo submitInfo;
  DepthBoundsParamTestInstance *pDVar7;
  
  this_00 = (this->super_DepthStencilBaseCase).super_TestInstance.m_context;
  local_148 = this_00->m_testCtx->m_log;
  pDVar7 = this;
  local_150 = __return_storage_ptr__;
  pVVar6 = Context::getUniversalQueue(this_00);
  width = (deUint32)pDVar7;
  DepthStencilBaseCase::beginRenderPass(&this->super_DepthStencilBaseCase);
  DepthStencilBaseCase::setDynamicViewportState(&this->super_DepthStencilBaseCase,width,height);
  DepthStencilBaseCase::setDynamicRasterizationState
            (&this->super_DepthStencilBaseCase,lineWidth,in_XMM1_Da,in_XMM2_Da,in_XMM3_Da);
  referenceFrame.super_TextureLevelPyramid.m_format.order = R;
  referenceFrame.super_TextureLevelPyramid.m_format.type = SNORM_INT8;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x51])
            (pDVar1,(this->super_DepthStencilBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  DepthStencilBaseCase::setDynamicDepthStencilState
            (&this->super_DepthStencilBaseCase,0.5,0.75,0xffffffff,0xffffffff,0,0xffffffff,
             0xffffffff,0);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x58])
            (pDVar1,(this->super_DepthStencilBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,1);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x4c])
            (pDVar1,(this->super_DepthStencilBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->super_DepthStencilBaseCase).m_pipeline_1.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x59])
            (pDVar1,(this->super_DepthStencilBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,4,1,0,0);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x59])
            (pDVar1,(this->super_DepthStencilBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,4,1,4,0);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x4c])
            (pDVar1,(this->super_DepthStencilBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->super_DepthStencilBaseCase).m_pipeline_2.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x59])
            (pDVar1,(this->super_DepthStencilBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,4,1,8,0);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x76])
            (pDVar1,(this->super_DepthStencilBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[0x4a])
            (pDVar1,(this->super_DepthStencilBaseCase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  (*pDVar1->_vptr_DeviceInterface[2])(pDVar1,pVVar6,1);
  pDVar1 = (this->super_DepthStencilBaseCase).m_vk;
  local_140 = pVVar6;
  result = (*pDVar1->_vptr_DeviceInterface[3])(pDVar1,pVVar6);
  ::vk::checkResult(result,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/dynamic_state/vktDynamicStateDSTests.cpp"
                    ,0x1e2);
  renderedFrame.m_format =
       ::vk::mapVkFormat((this->super_DepthStencilBaseCase).m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D(&referenceFrame,&renderedFrame.m_format,0x80,0x80);
  tcu::Texture2D::allocLevel(&referenceFrame,0);
  renderedFrame.m_format.order = R;
  renderedFrame.m_format.type = SNORM_INT8;
  renderedFrame.m_size.m_data[0] = 0;
  renderedFrame.m_size.m_data[1] = 0x3f800000;
  tcu::clear(referenceFrame.super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame);
  local_138 = (double)referenceFrame.m_height * 0.5;
  local_130 = (double)referenceFrame.m_width * 0.5;
  y = 0;
  iVar2 = referenceFrame.m_width;
  if (referenceFrame.m_width < 1) {
    iVar2 = y;
  }
  iVar3 = referenceFrame.m_height;
  if (referenceFrame.m_height < 1) {
    iVar3 = y;
  }
  for (; y != iVar3; y = y + 1) {
    local_164 = (float)((double)y / local_138) + -1.0;
    for (x_00 = 0; iVar2 != x_00; x_00 = x_00 + 1) {
      fVar8 = (float)((double)x_00 / local_130) + -1.0;
      if ((((1.0 < local_164) || (local_164 < -1.0)) || (fVar8 < 0.0)) || (1.0 < fVar8)) {
        renderedFrame.m_format.order = R;
        renderedFrame.m_format.type = 0x3f800000;
        renderedFrame.m_size.m_data[0] = 0;
        renderedFrame.m_size.m_data[1] = 0x3f800000;
        tcu::PixelBufferAccess::setPixel
                  (referenceFrame.super_TextureLevelPyramid.m_access.
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame,x_00,y,0);
      }
      else {
        renderedFrame.m_format.order = R;
        renderedFrame.m_format.type = SNORM_INT8;
        renderedFrame.m_size.m_data._0_8_ = &DAT_3f8000003f800000;
        tcu::PixelBufferAccess::setPixel
                  (referenceFrame.super_TextureLevelPyramid.m_access.
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame,x_00,y,0);
      }
    }
  }
  this_01 = (this->super_DepthStencilBaseCase).m_colorTargetImage.m_ptr;
  allocator = Context::getDefaultAllocator
                        ((this->super_DepthStencilBaseCase).super_TestInstance.m_context);
  local_158 = 0;
  local_160 = 0;
  Draw::Image::readSurface
            (&renderedFrame,this_01,local_140,allocator,VK_IMAGE_LAYOUT_GENERAL,
             (VkOffset3D)(ZEXT412(0) << 0x40),0x80,0x80,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  bVar5 = tcu::fuzzyCompare(local_148,"Result","Image comparison result",
                            &(referenceFrame.super_TextureLevelPyramid.m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                             super_ConstPixelBufferAccess,&renderedFrame,0.05,COMPARE_LOG_RESULT);
  pTVar4 = local_150;
  if (bVar5) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_128,"Image verification passed",&local_165);
    pTVar4->m_code = QP_TEST_RESULT_PASS;
    std::__cxx11::string::string((string *)&pTVar4->m_description,local_128);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              (local_128,"Image verification failed",&local_165);
    pTVar4->m_code = QP_TEST_RESULT_FAIL;
    std::__cxx11::string::string((string *)&pTVar4->m_description,local_128);
  }
  std::__cxx11::string::~string(local_128);
  tcu::Texture3D::~Texture3D((Texture3D *)&referenceFrame);
  return pTVar4;
}

Assistant:

virtual tcu::TestStatus iterate (void)
	{
		tcu::TestLog &log = m_context.getTestContext().getLog();
		const vk::VkQueue queue = m_context.getUniversalQueue();

		beginRenderPass();

		// set states here
		setDynamicViewportState(WIDTH, HEIGHT);
		setDynamicRasterizationState();
		setDynamicBlendState();
		setDynamicDepthStencilState(0.5f, 0.75f);

		const vk::VkDeviceSize vertexBufferOffset = 0;
		const vk::VkBuffer vertexBuffer = m_vertexBuffer->object();
		m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

		m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline_1);
		m_vk.cmdDraw(*m_cmdBuffer, 4, 1, 0, 0);
		m_vk.cmdDraw(*m_cmdBuffer, 4, 1, 4, 0);

		m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline_2);
		m_vk.cmdDraw(*m_cmdBuffer, 4, 1, 8, 0);

		m_vk.cmdEndRenderPass(*m_cmdBuffer);
		m_vk.endCommandBuffer(*m_cmdBuffer);

		vk::VkSubmitInfo submitInfo =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);

		// validation
		{
			VK_CHECK(m_vk.queueWaitIdle(queue));

			tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
			referenceFrame.allocLevel(0);

			const deInt32 frameWidth = referenceFrame.getWidth();
			const deInt32 frameHeight = referenceFrame.getHeight();

			tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

			for (int y = 0; y < frameHeight; y++)
			{
				const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

				for (int x = 0; x < frameWidth; x++)
				{
					const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

					if (xCoord >= 0.0f && xCoord <= 1.0f && yCoord >= -1.0f && yCoord <= 1.0f)
						referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f), x, y);
					else
						referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f), x, y);
				}
			}

			const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
			const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
				vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

			if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
				referenceFrame.getLevel(0), renderedFrame, 0.05f,
				tcu::COMPARE_LOG_RESULT))
			{
				return tcu::TestStatus(QP_TEST_RESULT_FAIL, "Image verification failed");
			}

			return tcu::TestStatus(QP_TEST_RESULT_PASS, "Image verification passed");
		}
	}